

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void processOptionsInternal
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *options,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *uniqueOptions,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugOptions,char *logName,string *language,OptionsParse parse)

{
  TargetPropertyEntry *pTVar1;
  undefined8 uVar2;
  pointer pbVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar5;
  cmake *this;
  undefined8 *puVar6;
  element_type **ppeVar7;
  long *plVar8;
  element_type *peVar9;
  pointer __args;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar10;
  string usedOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryOptions;
  __hashtable *__h;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [56];
  undefined8 local_130 [2];
  element_type *local_120 [2];
  element_type **local_110;
  long local_108;
  element_type *local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  long *local_88 [2];
  long local_78 [2];
  pointer local_68;
  cmGeneratorExpressionDAGChecker *local_60;
  string *local_58;
  pointer local_50;
  element_type *local_48;
  cmListFileBacktrace local_40;
  
  local_50 = (entries->
             super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_68 = (entries->
             super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_168._48_8_ = tgt;
  local_d0 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)options;
  local_60 = dagChecker;
  local_58 = config;
  local_48 = (element_type *)uniqueOptions;
  if (local_50 != local_68) {
    do {
      pTVar1 = *local_50;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar4 = (*pTVar1->_vptr_TargetPropertyEntry[3])
                        (pTVar1,(cmLocalGenerator *)
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                (local_168._48_8_ + 0x10))->_vptr__Sp_counted_base,local_58,0,
                         local_168._48_8_,local_60,language);
      cmSystemTools::ExpandListArgument((string *)CONCAT44(extraout_var,iVar4),&local_a8,false);
      pbVar3 = local_a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_f0 = &local_e0;
      local_e8 = 0;
      local_e0 = 0;
      for (__args = local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != pbVar3; __args = __args + 1
          ) {
        local_198._0_8_ = local_48;
        pVar10 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)local_48,__args,local_198);
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if ((parse == Shell) &&
             (iVar4 = strncmp((__args->_M_dataplus)._M_p,"SHELL:",6), iVar4 == 0)) {
            local_198._0_8_ = (element_type *)0x0;
            local_198._8_8_ = (element_type *)0x0;
            local_188._0_8_ = (cmState *)0x0;
            cmSystemTools::ParseUnixCommandLine
                      ((__args->_M_dataplus)._M_p + 6,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_198);
            uVar2 = local_198._8_8_;
            for (peVar9 = (element_type *)local_198._0_8_; peVar9 != (element_type *)uVar2;
                peVar9 = (element_type *)&(peVar9->field_0).Context.FilePath) {
              (*pTVar1->_vptr_TargetPropertyEntry[4])((cmListFileBacktrace *)local_178,pTVar1);
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string,cmListFileBacktrace>
                        (local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)peVar9,(cmListFileBacktrace *)local_178);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_198);
          }
          else {
            (*pTVar1->_vptr_TargetPropertyEntry[4])((cmListFileBacktrace *)local_198,pTVar1);
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string_const&,cmListFileBacktrace>
                      (local_d0,__args,(cmListFileBacktrace *)local_198);
            if ((element_type *)local_198._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
            }
          }
          if (debugOptions) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_178," * ",__args);
            plVar5 = (long *)std::__cxx11::string::append((char *)local_178);
            peVar9 = (element_type *)(plVar5 + 2);
            if ((element_type *)*plVar5 == peVar9) {
              local_188._0_8_ = (peVar9->field_0).Bottom.State;
              local_188._8_8_ = plVar5[3];
              local_198._0_8_ = (element_type *)local_188;
            }
            else {
              local_188._0_8_ = (peVar9->field_0).Bottom.State;
              local_198._0_8_ = (element_type *)*plVar5;
            }
            local_198._8_8_ = plVar5[1];
            *plVar5 = (long)peVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_f0,local_198._0_8_);
            if ((element_type *)local_198._0_8_ != (element_type *)local_188) {
              operator_delete((void *)local_198._0_8_,
                              (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                         *)local_188._0_8_)->_M_t)._M_impl.field_0x1);
            }
            if ((element_type *)local_178._0_8_ != (element_type *)local_168) {
              operator_delete((void *)local_178._0_8_,
                              (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                         *)local_168._0_8_)->_M_t)._M_impl.field_0x1);
            }
          }
        }
      }
      if (local_e8 != 0) {
        this = cmLocalGenerator::GetCMakeInstance
                         ((cmLocalGenerator *)
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_168._48_8_ + 0x10)
                          )->_vptr__Sp_counted_base);
        local_88[0] = local_78;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Used ","");
        plVar5 = (long *)std::__cxx11::string::append((char *)local_88);
        ppeVar7 = (element_type **)(plVar5 + 2);
        if ((element_type **)*plVar5 == ppeVar7) {
          local_100 = *ppeVar7;
          uStack_f8 = (undefined4)plVar5[3];
          uStack_f4 = *(undefined4 *)((long)plVar5 + 0x1c);
          local_110 = &local_100;
        }
        else {
          local_100 = *ppeVar7;
          local_110 = (element_type **)*plVar5;
        }
        local_108 = plVar5[1];
        *plVar5 = (long)ppeVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_130[0] = local_120;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_130," for target ","");
        peVar9 = (element_type *)0xf;
        if (local_110 != &local_100) {
          peVar9 = local_100;
        }
        if (peVar9 < (element_type *)(local_130[1] + local_108)) {
          peVar9 = (element_type *)0xf;
          if ((element_type **)local_130[0] != local_120) {
            peVar9 = local_120[0];
          }
          if (peVar9 < (element_type *)(local_130[1] + local_108)) goto LAB_0033c839;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)local_130,0,(char *)0x0,(ulong)local_110);
        }
        else {
LAB_0033c839:
          puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,local_130[0]);
        }
        local_168._16_8_ = local_168 + 0x20;
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_168._32_8_ = *plVar5;
          local_168._40_8_ = puVar6[3];
        }
        else {
          local_168._32_8_ = *plVar5;
          local_168._16_8_ = (long *)*puVar6;
        }
        local_168._24_8_ = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   (local_168 + 0x10,*(ulong *)(*(long *)local_168._48_8_ + 0xc0));
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_b8 = *plVar8;
          lStack_b0 = plVar5[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8 = *plVar8;
          local_c8 = (long *)*plVar5;
        }
        local_c0 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_178._0_8_ = local_168;
        peVar9 = (element_type *)(plVar5 + 2);
        if ((element_type *)*plVar5 == peVar9) {
          local_168._0_8_ = (peVar9->field_0).Bottom.State;
          local_168._8_8_ = plVar5[3];
        }
        else {
          local_168._0_8_ = (peVar9->field_0).Bottom.State;
          local_178._0_8_ = (element_type *)*plVar5;
        }
        local_178._8_8_ = plVar5[1];
        *plVar5 = (long)peVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append(local_178,(ulong)local_f0);
        local_198._0_8_ = local_188;
        peVar9 = (element_type *)(plVar5 + 2);
        if ((element_type *)*plVar5 == peVar9) {
          local_188._0_8_ = (peVar9->field_0).Bottom.State;
          local_188._8_8_ = plVar5[3];
        }
        else {
          local_188._0_8_ = (peVar9->field_0).Bottom.State;
          local_198._0_8_ = (element_type *)*plVar5;
        }
        local_198._8_8_ = plVar5[1];
        *plVar5 = (long)peVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        (*pTVar1->_vptr_TargetPropertyEntry[4])(&local_40,pTVar1);
        cmake::IssueMessage(this,LOG,(string *)local_198,&local_40);
        if (local_40.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((element_type *)local_198._0_8_ != (element_type *)local_188) {
          operator_delete((void *)local_198._0_8_,
                          (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                     *)local_188._0_8_)->_M_t)._M_impl.field_0x1);
        }
        if ((element_type *)local_178._0_8_ != (element_type *)local_168) {
          operator_delete((void *)local_178._0_8_,
                          (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                     *)local_168._0_8_)->_M_t)._M_impl.field_0x1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if ((undefined1 *)local_168._16_8_ != local_168 + 0x20) {
          operator_delete((void *)local_168._16_8_,local_168._32_8_ + 1);
        }
        if ((element_type **)local_130[0] != local_120) {
          operator_delete((void *)local_130[0],(ulong)((long)&local_120[0]->field_0 + 1));
        }
        if (local_110 != &local_100) {
          operator_delete(local_110,(ulong)((long)&local_100->field_0 + 1));
        }
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a8);
      local_50 = local_50 + 1;
    } while (local_50 != local_68);
  }
  return;
}

Assistant:

static void processOptionsInternal(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& options,
  std::unordered_set<std::string>& uniqueOptions,
  cmGeneratorExpressionDAGChecker* dagChecker, const std::string& config,
  bool debugOptions, const char* logName, std::string const& language,
  OptionsParse parse)
{
  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    std::vector<std::string> entryOptions;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt,
                                                      dagChecker, language),
                                      entryOptions);
    std::string usedOptions;
    for (std::string const& opt : entryOptions) {
      if (uniqueOptions.insert(opt).second) {
        if (parse == OptionsParse::Shell &&
            cmHasLiteralPrefix(opt, "SHELL:")) {
          std::vector<std::string> tmp;
          cmSystemTools::ParseUnixCommandLine(opt.c_str() + 6, tmp);
          for (std::string& o : tmp) {
            options.emplace_back(std::move(o), entry->GetBacktrace());
          }
        } else {
          options.emplace_back(opt, entry->GetBacktrace());
        }
        if (debugOptions) {
          usedOptions += " * " + opt + "\n";
        }
      }
    }
    if (!usedOptions.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used ") + logName + std::string(" for target ") +
          tgt->GetName() + ":\n" + usedOptions,
        entry->GetBacktrace());
    }
  }
}